

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManEquivCountLits(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar2 = 0;
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (iVar2 = 0, p->pNexts != (int *)0x0)) {
    iVar2 = p->nObjs;
    iVar3 = 0;
    if (1 < (long)iVar2) {
      iVar3 = 0;
      lVar4 = 1;
      iVar5 = 0;
      do {
        if ((~(uint)p->pReprs[lVar4] & 0xfffffff) == 0) {
          if (p->pNexts[lVar4] < 1) {
            iVar3 = iVar3 + 1;
          }
          else {
            iVar5 = iVar5 + 1;
          }
        }
        lVar4 = lVar4 + 1;
      } while (iVar2 != lVar4);
      iVar3 = iVar3 + iVar5;
    }
    iVar5 = p->vCos->nSize;
    iVar1 = p->vCis->nSize;
    iVar2 = (iVar2 - iVar3) + iVar5 + iVar1 + ~(iVar1 + iVar5);
  }
  return iVar2;
}

Assistant:

int Gia_ManEquivCountLits( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
    }
    CounterX -= Gia_ManCoNum(p);
    return Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
}